

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_roa_request.cpp
# Opt level: O0

int __thiscall AliRoaRequest::CommitRequest(AliRoaRequest *this)

{
  bool bVar1;
  int iVar2;
  char *buf_in;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  undefined1 local_200 [8];
  string sign;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  allocator<char> local_179;
  key_type local_178;
  _Self local_158;
  allocator<char> local_149;
  key_type local_148;
  _Self local_128;
  allocator<char> local_119;
  key_type local_118;
  _Self local_f8;
  allocator<char> local_e9;
  key_type local_e8;
  _Self local_c8;
  allocator<char> local_b9;
  key_type local_b8;
  _Self local_98;
  allocator<char> local_89;
  key_type local_88;
  _Self local_68 [3];
  undefined1 local_50 [8];
  string compose_url;
  string gmt_time;
  AliRoaRequest *this_local;
  
  getHttpGmtTime_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &(this->super_AliHttpRequest).method_,anon_var_dwarf_16a34f + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Accept",&local_89);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&(this->super_AliHttpRequest).map_request_headers_,&local_88);
  local_98._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&(this->super_AliHttpRequest).map_request_headers_);
  bVar1 = std::operator!=(local_68,&local_98);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Accept",&local_b9);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&(this->super_AliHttpRequest).map_request_headers_,&local_b8);
    std::__cxx11::string::append((string *)local_50);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  std::__cxx11::string::append(local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Content-Md5",&local_e9);
  local_c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&(this->super_AliHttpRequest).map_request_headers_,&local_e8);
  local_f8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&(this->super_AliHttpRequest).map_request_headers_);
  bVar1 = std::operator!=(&local_c8,&local_f8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Content-Md5",&local_119);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&(this->super_AliHttpRequest).map_request_headers_,&local_118);
    std::__cxx11::string::append((string *)local_50);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
  }
  std::__cxx11::string::append(local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"Content-Type",&local_149)
  ;
  local_128._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&(this->super_AliHttpRequest).map_request_headers_,&local_148);
  local_158._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&(this->super_AliHttpRequest).map_request_headers_);
  bVar1 = std::operator!=(&local_128,&local_158);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"Content-Type",&local_179);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&(this->super_AliHttpRequest).map_request_headers_,&local_178);
    std::__cxx11::string::append((string *)local_50);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
  }
  std::__cxx11::string::append(local_50);
  std::__cxx11::string::append((string *)local_50);
  std::__cxx11::string::append(local_50);
  std::__cxx11::string::append(local_50);
  std::__cxx11::string::append(local_50);
  std::operator+(&local_1c0,"x-acs-version:",&this->version_);
  std::operator+(&local_1a0,&local_1c0,anon_var_dwarf_16a34f + 8);
  std::__cxx11::string::append((string *)local_50);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  AliHttpRequest::GetPath_abi_cxx11_
            ((string *)((long)&sign.field_2 + 8),&this->super_AliHttpRequest,true);
  std::__cxx11::string::append((string *)local_50);
  std::__cxx11::string::~string((string *)(sign.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_220,(string *)&this->secret_);
  buf_in = (char *)std::__cxx11::string::c_str();
  iVar2 = std::__cxx11::string::size();
  encode_compute_hmac_sha1((string *)local_200,&local_220,buf_in,iVar2);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Authorization",&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"acs ",&local_2c9);
  std::operator+(&local_2a8,&local_2c8,&this->appid_);
  std::operator+(&local_288,&local_2a8,":");
  std::operator+(&local_268,&local_288,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
  AliHttpRequest::AddRequestHeader(&this->super_AliHttpRequest,&local_240,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"x-acs-signature-method",&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"HMAC-SHA1",&local_319);
  AliHttpRequest::AddRequestHeader(&this->super_AliHttpRequest,&local_2f0,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_340,"x-acs-signature-version",&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"1.0",&local_369);
  AliHttpRequest::AddRequestHeader(&this->super_AliHttpRequest,&local_340,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"x-acs-version",&local_391);
  std::__cxx11::string::string((string *)&local_3b8,(string *)&this->version_);
  AliHttpRequest::AddRequestHeader(&this->super_AliHttpRequest,&local_390,&local_3b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"Date",&local_3d9);
  std::__cxx11::string::string
            ((string *)&local_400,(string *)(compose_url.field_2._M_local_buf + 8));
  AliHttpRequest::AddRequestHeader(&this->super_AliHttpRequest,&local_3d8,&local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  iVar2 = AliHttpRequest::CommitRequest(&this->super_AliHttpRequest);
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(compose_url.field_2._M_local_buf + 8));
  return iVar2;
}

Assistant:

int AliRoaRequest::CommitRequest() {
  std::string gmt_time = getHttpGmtTime();

  std::string compose_url = this->method_ + "\n";
  if(map_request_headers_.find("Accept") != map_request_headers_.end()) {
    compose_url.append(map_request_headers_["Accept"]);
  }
  compose_url.append("\n");
  if(map_request_headers_.find("Content-Md5") != map_request_headers_.end()) {
    compose_url.append(map_request_headers_["Content-Md5"]);
  } 
  compose_url.append("\n");
  if(map_request_headers_.find("Content-Type") != map_request_headers_.end()) {
    compose_url.append(map_request_headers_["Content-Type"]);
  }

  compose_url.append("\n");
  compose_url.append(gmt_time);
  compose_url.append("\n");
  compose_url.append("x-acs-signature-method:HMAC-SHA1\n");
  compose_url.append("x-acs-signature-version:1.0\n");
  compose_url.append("x-acs-version:" + version_ + "\n");
  compose_url.append(this->GetPath());

  ALI_LOG("compose_url=%s\n", compose_url.c_str());

  std::string sign = encode_compute_hmac_sha1(this->secret_, (char *)compose_url.c_str(), compose_url.size());

  AddRequestHeader("Authorization", std::string("acs ") + appid_ + ":" + sign);
  AddRequestHeader("x-acs-signature-method", "HMAC-SHA1");
  AddRequestHeader("x-acs-signature-version", "1.0");
  AddRequestHeader("x-acs-version", version_);
  AddRequestHeader("Date", gmt_time);
  return AliHttpRequest::CommitRequest();
}